

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O3

void __thiscall
amrex::Amr::initialInit
          (Amr *this,Real strt_time,Real stop_time,BoxArray *lev0_grids,
          Vector<int,_std::allocator<int>_> *pmap)

{
  InitializeInit(this,strt_time,stop_time,lev0_grids,pmap);
  FinalizeInit(this,this->cumtime,stop_time);
  return;
}

Assistant:

void
Amr::initialInit (Real              strt_time,
                  Real              stop_time,
                  const BoxArray*   lev0_grids,
                  const Vector<int>* pmap)
{
    BL_PROFILE("Amr::initialInit()");
    InitializeInit(strt_time, stop_time, lev0_grids, pmap);

    // This is a subtlety, but in the case where we are initializing the data
    //   from a plotfile, we want to use the time read in from the plotfile as
    //   the start time instead of using "strt_time".
    // The Amr data "cumtime" has been set in InitializeInit; if we are restarting
    //   from a plotfile, then cumtime must be re-defined in that initialization routine.
    //   Thus here we pass "cumtime" rather than "strt_time" to FinalizeInit.
    FinalizeInit  (cumtime, stop_time);
}